

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O2

obj * add_to_container(obj *container,obj *obj)

{
  int iVar1;
  obj *local_28;
  obj *local_20;
  
  local_28 = obj;
  if ((int)obj->where != 0) {
    panic("add_to_container: obj not free (%d,%d,%d)",(ulong)(uint)(int)obj->where,
          (ulong)(uint)(int)obj->otyp,(ulong)(uint)(int)obj->invlet);
  }
  if (1 < (byte)(container->where - 3U)) {
    obj_no_longer_held(obj);
  }
  local_20 = (obj *)&container->cobj;
  do {
    local_20 = local_20->nobj;
    if (local_20 == (obj *)0x0) {
      local_28->where = '\x02';
      (local_28->v).v_nexthere = container;
      local_28->nobj = container->cobj;
      container->cobj = local_28;
      return local_28;
    }
    iVar1 = merged(&local_20,&local_28);
  } while (iVar1 == 0);
  return local_20;
}

Assistant:

struct obj *add_to_container(struct obj *container, struct obj *obj)
{
    struct obj *otmp;

    if (obj->where != OBJ_FREE) {
	panic("add_to_container: obj not free (%d,%d,%d)",
	      obj->where, obj->otyp, obj->invlet);
    }

    if (container->where != OBJ_INVENT && container->where != OBJ_MINVENT)
	obj_no_longer_held(obj);

    /* merge if possible */
    for (otmp = container->cobj; otmp; otmp = otmp->nobj)
	if (merged(&otmp, &obj)) return otmp;

    obj->where = OBJ_CONTAINED;
    obj->ocontainer = container;
    obj->nobj = container->cobj;
    container->cobj = obj;
    return obj;
}